

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Vec3fa __thiscall
embree::XMLLoader::load<embree::Vec3fa>(XMLLoader *this,Ref<embree::XML> *xml,Vec3fa *opt)

{
  long lVar1;
  runtime_error *this_00;
  float *in_RCX;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ulong in_XMM1_Qa;
  Vec3fa VVar6;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  lVar1 = *(long *)&opt->field_0;
  if (lVar1 == 0) {
    fVar2 = *in_RCX;
    fVar3 = in_RCX[1];
    fVar4 = in_RCX[2];
    fVar5 = in_RCX[3];
  }
  else {
    if (*(long *)(lVar1 + 0xa0) - (long)*(Token **)(lVar1 + 0x98) != 0xd8) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ParseLocation::str_abi_cxx11_(&local_58,(ParseLocation *)(*(long *)&opt->field_0 + 0x10));
      std::operator+(&local_38,&local_58,": wrong float3 body");
      std::runtime_error::runtime_error(this_00,(string *)&local_38);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    fVar2 = Token::Float(*(Token **)(lVar1 + 0x98),true);
    fVar3 = Token::Float((Token *)(*(long *)(*(long *)&opt->field_0 + 0x98) + 0x48),true);
    fVar4 = Token::Float((Token *)(*(long *)(*(long *)&opt->field_0 + 0x98) + 0x90),true);
    fVar5 = 0.0;
    in_XMM1_Qa = (ulong)(uint)fVar4;
  }
  *(float *)&(this->path).filename._M_dataplus._M_p = fVar2;
  *(float *)((long)&(this->path).filename._M_dataplus._M_p + 4) = fVar3;
  *(float *)&(this->path).filename._M_string_length = fVar4;
  *(float *)((long)&(this->path).filename._M_string_length + 4) = fVar5;
  VVar6.field_0.m128[1] = fVar3;
  VVar6.field_0.m128[0] = fVar2;
  VVar6.field_0._8_8_ = in_XMM1_Qa;
  return (Vec3fa)VVar6.field_0;
}

Assistant:

Vec3fa XMLLoader::load<Vec3fa>(const Ref<XML>& xml, const Vec3fa& opt) {
    if (xml == null) return opt;
    if (xml->body.size() != 3) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong float3 body");
    return Vec3fa(xml->body[0].Float(),xml->body[1].Float(),xml->body[2].Float());
  }